

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall CommandReader::submit_buffer(CommandReader *this)

{
  char *pcVar1;
  char *pcVar2;
  iterator iVar3;
  __string_type content;
  key_type local_68;
  long *local_48 [2];
  long local_38 [2];
  
  std::__cxx11::stringbuf::str();
  if ((local_68._M_string_length != 0) || (this->forced == true)) {
    if ((this->executable)._M_string_length == 0) {
      iVar3 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::find(&bb_commands_abi_cxx11_._M_h,&local_68);
      pcVar2 = BUSYBOX;
      if (iVar3.
          super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->arguments,&local_68);
        std::__cxx11::string::swap((string *)&this->executable);
        goto LAB_001053b7;
      }
      pcVar1 = (char *)(this->executable)._M_string_length;
      strlen(BUSYBOX);
      std::__cxx11::string::_M_replace((ulong)&this->executable,0,pcVar1,(ulong)pcVar2);
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->arguments
               ,&local_68);
  }
LAB_001053b7:
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"");
  std::__cxx11::stringbuf::str((string *)&this->field_0x58);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  std::ios::clear((int)&this->buffer + (int)*(undefined8 *)(*(long *)&this->buffer + -0x18));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void submit_buffer() {
    auto content = this->buffer.str();
    // ignore multiple empty characters, but submit if quoted
    if (!content.empty() || this->forced) {
      if (this->executable.empty()) {
        if (bb_commands.find(content) != bb_commands.end()) {
          // use busybox provided command
          this->executable = BUSYBOX;
          this->arguments.push_back(std::move(content));
        } else {
          // command as-is. argv[0] should also be executable path
          this->arguments.push_back(content);
          this->executable.swap(content);
        }
      } else {
        this->arguments.push_back(std::move(content));
      }
    }

    this->buffer.str("");
    this->buffer.clear();
  }